

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Aircraft.cpp
# Opt level: O3

void __thiscall
XPMP2::Aircraft::Aircraft
          (Aircraft *this,string *_icaoType,string *_icaoAirline,string *_livery,
          XPMPPlaneID _modeS_id,string *_cslId)

{
  long lVar1;
  allocator_type local_81;
  string *local_80;
  XPMPPlaneID local_74;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  vector<float,_std::allocator<float>_> *local_50;
  string *local_48;
  string *local_40;
  value_type_conflict1 local_34;
  
  this->_vptr_Aircraft = (_func_int **)&PTR__Aircraft_002dd108;
  this->modeS_id = 0;
  local_58 = &(this->acIcaoType).field_2;
  (this->acIcaoType)._M_dataplus._M_p = (pointer)local_58;
  (this->acIcaoType)._M_string_length = 0;
  (this->acIcaoType).field_2._M_local_buf[0] = '\0';
  local_60 = &(this->acIcaoAirline).field_2;
  (this->acIcaoAirline)._M_dataplus._M_p = (pointer)local_60;
  (this->acIcaoAirline)._M_string_length = 0;
  (this->acIcaoAirline).field_2._M_local_buf[0] = '\0';
  local_68 = &(this->acLivery).field_2;
  (this->acLivery)._M_dataplus._M_p = (pointer)local_68;
  (this->acLivery)._M_string_length = 0;
  (this->acLivery).field_2._M_local_buf[0] = '\0';
  (this->drawInfo).structSize = 0;
  (this->drawInfo).x = 0.0;
  (this->drawInfo).y = 0.0;
  (this->drawInfo).z = 0.0;
  (this->drawInfo).z = 0.0;
  (this->drawInfo).pitch = 0.0;
  (this->drawInfo).heading = 0.0;
  (this->drawInfo).roll = 0.0;
  (this->drawInfo).structSize = 0x1c;
  this->v_x = 0.0;
  this->v_y = 0.0;
  *(undefined8 *)((long)&this->v_y + 1) = 0;
  local_50 = &this->v;
  local_34 = 0.0;
  local_80 = _cslId;
  local_74 = _modeS_id;
  local_48 = _icaoAirline;
  local_40 = _livery;
  std::vector<float,_std::allocator<float>_>::vector
            (local_50,DAT_002ec020 - DR_NAMES >> 3,&local_34,&local_81);
  local_70 = &(this->label).field_2;
  (this->label)._M_dataplus._M_p = (pointer)local_70;
  (this->label)._M_string_length = 0;
  (this->label).field_2._M_local_buf[0] = '\0';
  this->colLabel[0] = 1.0;
  this->colLabel[1] = 1.0;
  this->colLabel[2] = 0.0;
  this->colLabel[3] = 1.0;
  this->bDrawLabel = true;
  this->vertOfsRatio = 1.0;
  this->gearDeflectRatio = 0.5;
  this->bClampToGround = false;
  this->aiPrio = 1;
  (this->acRadar).size = 0x18;
  (this->acRadar).code = 0;
  (this->acRadar).mode = xpmpTransponderMode_ModeC;
  (this->listContrail).super__List_base<void_*,_std::allocator<void_*>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)&this->listContrail;
  (this->listContrail).super__List_base<void_*,_std::allocator<void_*>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&this->listContrail;
  (this->listContrail).super__List_base<void_*,_std::allocator<void_*>_>._M_impl._M_node._M_size = 0
  ;
  this->contrailNum = 0;
  this->contrailDist_m = 5;
  this->contrailLifeTime = 0x19;
  (this->wake).wingSpan_m = NAN;
  (this->wake).wingArea_m2 = NAN;
  (this->wake).mass_kg = NAN;
  (this->acInfoTexts).size = 0xa8;
  memset((this->acInfoTexts).tailNum,0,0x9f);
  this->bValid = true;
  this->bVisible = true;
  this->bRender = true;
  this->pCSLMdl = (CSLModel *)0x0;
  this->matchQuality = -1;
  this->acRelGrp = 0;
  this->prev_x = 0.0;
  this->prev_y = 0.0;
  this->prev_z = 0.0;
  this->prev_ts = 0.0;
  this->gs_kn = 0.0;
  this->lat1s = NAN;
  this->lon1s = NAN;
  this->alt1s_ft = NAN;
  this->tsResetTouchDown = NAN;
  (this->listInst).super__List_base<void_*,_std::allocator<void_*>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)&this->listInst;
  (this->listInst).super__List_base<void_*,_std::allocator<void_*>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&this->listInst;
  (this->listInst).super__List_base<void_*,_std::allocator<void_*>_>._M_impl._M_node._M_size = 0;
  this->tcasTargetIdx = -1;
  this->camTimLstUpd = 0.0;
  this->camDist = 0.0;
  *(undefined8 *)&this->camBearing = 0;
  *(undefined8 *)((long)&this->hProbe + 4) = 0;
  this->mapIconCol = 0;
  this->mapX = 0.0;
  this->mapY = 0.0;
  (this->mapLabel)._M_dataplus._M_p = (pointer)&(this->mapLabel).field_2;
  (this->mapLabel)._M_string_length = 0;
  (this->mapLabel).field_2._M_local_buf[0] = '\0';
  this->sndMinDist = 0x32;
  lVar1 = 0x2b8;
  do {
    *(undefined1 *)((long)this + lVar1 + -0x10) = 1;
    *(undefined8 *)((long)this + lVar1 + -8) = 0;
    *(undefined8 *)((long)&this->_vptr_Aircraft + lVar1) = 0x3f8000007fc00000;
    lVar1 = lVar1 + 0x18;
  } while (lVar1 != 0x330);
  this->bChnMuted = false;
  (this->chnList).super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)&this->chnList;
  (this->chnList).super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&this->chnList;
  (this->chnList).super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl._M_node.
  _M_size = 0;
  this->skipCounter = 0;
  this->bDestroyInst = false;
  Create(this,_icaoType,local_48,local_40,local_74,local_80,(CSLModel *)0x0);
  return;
}

Assistant:

Aircraft::Aircraft(const std::string& _icaoType,
                   const std::string& _icaoAirline,
                   const std::string& _livery,
                   XPMPPlaneID _modeS_id,
                   const std::string& _cslId) :
drawInfo({sizeof(drawInfo), 0.0f, 0.0f, 0.0f, 0.0f, 0.0f, 0.0f}),
// create an approrpiately sized 'v' array and initialize with zeroes
v(DR_NAMES.size(), 0.0f)
{
    // Create the plane right away
    Create(_icaoType, _icaoAirline, _livery, _modeS_id, _cslId);
}